

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O1

void ReadArray<aiVertexWeight>(IOStream *stream,aiVertexWeight *out,uint size)

{
  uint uVar1;
  ulong uVar2;
  float fVar3;
  
  if (stream == (IOStream *)0x0) {
    __assert_fail("nullptr != stream",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Assbin/AssbinLoader.cpp"
                  ,0xc6,"void ReadArray(IOStream *, T *, unsigned int) [T = aiVertexWeight]");
  }
  if (out != (aiVertexWeight *)0x0) {
    if (size != 0) {
      uVar2 = 0;
      do {
        uVar1 = Read<unsigned_int>(stream);
        fVar3 = Read<float>(stream);
        out[uVar2].mVertexId = uVar1;
        out[uVar2].mWeight = fVar3;
        uVar2 = uVar2 + 1;
      } while (size != uVar2);
    }
    return;
  }
  __assert_fail("nullptr != out",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Assbin/AssbinLoader.cpp"
                ,199,"void ReadArray(IOStream *, T *, unsigned int) [T = aiVertexWeight]");
}

Assistant:

void ReadArray( IOStream *stream, T * out, unsigned int size) {
    ai_assert( nullptr != stream );
    ai_assert( nullptr != out );

    for (unsigned int i=0; i<size; i++) {
        out[i] = Read<T>(stream);
    }
}